

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

deInt32 __thiscall
sglr::ReferenceContext::getAttribLocation(ReferenceContext *this,deUint32 program,char *name)

{
  bool bVar1;
  __type _Var2;
  deBool dVar3;
  size_type sVar4;
  reference __lhs;
  ulong local_70;
  size_t ndx;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string nameString;
  ShaderProgramObjectContainer *shaderProg;
  char *name_local;
  deUint32 program_local;
  ReferenceContext *this_local;
  
  nameString.field_2._8_8_ =
       rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::find(&this->m_programs,program);
  do {
    if (nameString.field_2._8_8_ == 0) {
      setError(this,0x502);
      return -1;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if (name != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,name,&local_51);
    std::allocator<char>::~allocator(&local_51);
    for (local_70 = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(*(long *)(nameString.field_2._8_8_ + 0x10) + 0xc0)), local_70 < sVar4;
        local_70 = local_70 + 1) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(*(long *)(nameString.field_2._8_8_ + 0x10) + 0xc0),local_70);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50);
      if (_Var2) {
        this_local._4_4_ = (deInt32)local_70;
        bVar1 = true;
        goto LAB_00ff5e33;
      }
    }
    bVar1 = false;
LAB_00ff5e33:
    std::__cxx11::string::~string((string *)local_50);
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  return -1;
}

Assistant:

deInt32 ReferenceContext::getAttribLocation (deUint32 program, const char *name)
{
	ShaderProgramObjectContainer* shaderProg = m_programs.find(program);

	RC_IF_ERROR(shaderProg == DE_NULL, GL_INVALID_OPERATION, -1);

	if (name)
	{
		std::string nameString(name);

		for (size_t ndx = 0; ndx < shaderProg->m_program->m_attributeNames.size(); ++ndx)
			if (shaderProg->m_program->m_attributeNames[ndx] == nameString)
				return (int)ndx;
	}

	return -1;
}